

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

int Bmc_FxCompute(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGia;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int (*paiVar10) [2];
  long lVar11;
  bool bVar12;
  int nCounter;
  int nCubes [2] [2];
  
  pGia = Gia_ManDupOnsetOffset(p);
  piVar4 = (int *)0x0;
  p_00 = Mf_ManGenerateCnf(pGia,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  uVar1 = p->vCos->nSize;
  iVar7 = p->vCis->nSize;
  iVar8 = p_00->nVars;
  iVar2 = sat_solver_nvars(s);
  nCubes[0][0] = 0;
  nCubes[0][1] = 0;
  nCubes[1][0] = 0;
  nCubes[1][1] = 0;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar3 = iVar7;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar3;
  if (iVar3 != 0) {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  p_01->pArray = piVar4;
  if (0 < iVar7) {
    iVar7 = -iVar7;
    do {
      Vec_IntPush(p_01,iVar8 + iVar7);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  sat_solver_setnvars(s,iVar2 + uVar1 * 4);
  if (0 < (int)uVar1) {
    iVar7 = 0;
    uVar9 = 0;
    do {
      paiVar10 = nCubes;
      lVar5 = 0;
      iVar8 = iVar2;
      do {
        lVar11 = 0;
        do {
          pcVar6 = "off";
          if (lVar11 == 0) {
            pcVar6 = " on";
          }
          printf("Out %3d %sset ",uVar9 & 0xffffffff,pcVar6);
          iVar3 = Bmc_FxSolve(s,(int)lVar11 + iVar7,iVar8 + (int)lVar11,p_01,0,0,&nCounter,
                              (Vec_Wec_t *)0x0);
          pcVar6 = "Mismatch";
          if (iVar3 == 0) {
LAB_0051a5b5:
            puts(pcVar6);
          }
          else if (iVar3 == -1) {
            pcVar6 = "Timeout";
            goto LAB_0051a5b5;
          }
          (*paiVar10)[lVar11] = (*paiVar10)[lVar11] + nCounter;
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        paiVar10 = paiVar10 + 1;
        iVar8 = iVar8 + uVar1 * 2;
        bVar12 = lVar5 == 0;
        lVar5 = lVar5 + 1;
      } while (bVar12);
      uVar9 = uVar9 + 1;
      iVar2 = iVar2 + 2;
      iVar7 = iVar7 + 2;
    } while (uVar9 != uVar1);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  sat_solver_delete(s);
  Cnf_DataFree(p_00);
  Gia_ManStop(pGia);
  printf("Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n",
         (ulong)nCubes[0] & 0xffffffff,(ulong)nCubes[0] >> 0x20,(ulong)nCubes[1] & 0xffffffff,
         (ulong)nCubes[1] >> 0x20);
  return 1;
}

Assistant:

int Bmc_FxCompute( Gia_Man_t * p )
{
    // create dual-output circuit with on-set/off-set
    extern Gia_Man_t * Gia_ManDupOnsetOffset( Gia_Man_t * p );
    Gia_Man_t * p2 = Gia_ManDupOnsetOffset( p );
    // create SAT solver
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p2, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nOuts = Gia_ManCoNum(p);
    int nCiVars = Gia_ManCiNum(p), iCiVarBeg = pCnf->nVars - nCiVars;// - 1;
    int o, i, n, RetValue, nCounter, iAuxVarStart = sat_solver_nvars( pSat );
    int nCubes[2][2] = {{0}};
    // create variables
    Vec_Int_t * vVars = Vec_IntAlloc( nCiVars );
    for ( n = 0; n < nCiVars; n++ )
        Vec_IntPush( vVars, iCiVarBeg + n );
    sat_solver_setnvars( pSat, iAuxVarStart + 4*nOuts );
    // iterate through outputs
    for ( o = 0; o < nOuts; o++ )
    for ( i = 0; i < 2; i++ )
    for ( n = 0; n < 2; n++ ) // 0=onset, 1=offset
//    for ( n = 1; n >= 0; n-- ) // 0=onset, 1=offset
    {
        printf( "Out %3d %sset ", o, n ? "off" : " on" );
        RetValue = Bmc_FxSolve( pSat, Abc_Var2Lit(o, n), iAuxVarStart + 2*i*nOuts + Abc_Var2Lit(o, n), vVars, 0, 0, &nCounter, NULL );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        nCubes[i][n] += nCounter;
    }
    // cleanup
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( p2 );
    printf( "Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n", nCubes[0][0], nCubes[0][1], nCubes[1][0], nCubes[1][1] );
    return 1;
}